

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O2

size_t __thiscall
Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create
          (AMFImporter *this,string *pID_R,string *pID_G,string *pID_B,string *pID_A)

{
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_> *this_00
  ;
  CAMFImporter_NodeElement_Texture *pCVar1;
  CAMFImporter_NodeElement_Texture *pCVar2;
  __type _Var3;
  bool bVar4;
  DeadlyImportError *pDVar5;
  ulong uVar6;
  ulong uVar7;
  size_t pStep;
  size_t *psVar8;
  size_t sVar9;
  size_t *psVar10;
  size_t pOffset;
  _List_node_base *p_Var11;
  anon_class_24_3_c796a13c CopyTextureData;
  CAMFImporter_NodeElement_Texture *src_texture [4];
  size_t tex_size;
  vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  src_texture_4check;
  size_t *local_c8;
  SPP_Texture converted_texture;
  string TextureConverted_ID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  TextureConverted_ID._M_dataplus._M_p = (pointer)&TextureConverted_ID.field_2;
  TextureConverted_ID._M_string_length = 0;
  TextureConverted_ID.field_2._M_local_buf[0] = '\0';
  if ((((pID_R->_M_string_length == 0) && (pID_G->_M_string_length == 0)) &&
      (pID_B->_M_string_length == 0)) && (pID_A->_M_string_length == 0)) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&converted_texture,
               "PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.",
               (allocator<char> *)src_texture);
    DeadlyImportError::DeadlyImportError(pDVar5,&converted_texture.ID);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+(&local_50,pID_R,"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tex_size,
                 &local_50,pID_G);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &src_texture_4check,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tex_size,"_")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &CopyTextureData,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &src_texture_4check,pID_B);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src_texture,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &CopyTextureData,"_");
  std::operator+(&converted_texture.ID,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src_texture,
                 pID_A);
  std::__cxx11::string::operator=((string *)&TextureConverted_ID,(string *)&converted_texture);
  std::__cxx11::string::~string((string *)&converted_texture);
  std::__cxx11::string::~string((string *)src_texture);
  std::__cxx11::string::~string((string *)&CopyTextureData);
  std::__cxx11::string::~string((string *)&src_texture_4check);
  std::__cxx11::string::~string((string *)&tex_size);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = &this->mTexture_Converted;
  sVar9 = 0;
  p_Var11 = (_List_node_base *)this_00;
  while (p_Var11 = (((_List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                      *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var11 != (_List_node_base *)this_00) {
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var11 + 1),&TextureConverted_ID);
    if (_Var3) goto LAB_003c1df1;
    sVar9 = sVar9 + 1;
  }
  src_texture[2] = (CAMFImporter_NodeElement_Texture *)0x0;
  src_texture[3] = (CAMFImporter_NodeElement_Texture *)0x0;
  src_texture[0] = (CAMFImporter_NodeElement_Texture *)0x0;
  src_texture[1] = (CAMFImporter_NodeElement_Texture *)0x0;
  src_texture_4check.
  super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  src_texture_4check.
  super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  src_texture_4check.
  super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  converted_texture.ID._M_dataplus._M_p = (pointer)&converted_texture.ID.field_2;
  converted_texture.ID._M_string_length = 0;
  converted_texture.ID.field_2._M_local_buf[0] = '\0';
  if (pID_R->_M_string_length == 0) {
    src_texture[0] = (CAMFImporter_NodeElement_Texture *)0x0;
    local_c8 = (size_t *)0x0;
  }
  else {
    bVar4 = Find_NodeElement(this,pID_R,ENET_Texture,(CAMFImporter_NodeElement **)&CopyTextureData);
    if (!bVar4) {
      Throw_ID_NotFound(this,pID_R);
    }
    src_texture[0] = (CAMFImporter_NodeElement_Texture *)CopyTextureData.tex_size;
    local_c8 = CopyTextureData.tex_size;
    tex_size = (size_t)CopyTextureData.tex_size;
    std::vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
    ::emplace_back<CAMFImporter_NodeElement_Texture*>
              ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                *)&src_texture_4check,(CAMFImporter_NodeElement_Texture **)&tex_size);
  }
  if (pID_G->_M_string_length == 0) {
    src_texture[1] = (CAMFImporter_NodeElement_Texture *)0x0;
    psVar10 = (size_t *)0x0;
  }
  else {
    bVar4 = Find_NodeElement(this,pID_G,ENET_Texture,(CAMFImporter_NodeElement **)&CopyTextureData);
    if (!bVar4) {
      Throw_ID_NotFound(this,pID_G);
    }
    psVar10 = CopyTextureData.tex_size;
    src_texture[1] = (CAMFImporter_NodeElement_Texture *)CopyTextureData.tex_size;
    tex_size = (size_t)CopyTextureData.tex_size;
    std::vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
    ::emplace_back<CAMFImporter_NodeElement_Texture*>
              ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                *)&src_texture_4check,(CAMFImporter_NodeElement_Texture **)&tex_size);
  }
  if (pID_B->_M_string_length == 0) {
    src_texture[2] = (CAMFImporter_NodeElement_Texture *)0x0;
    psVar8 = (size_t *)0x0;
  }
  else {
    bVar4 = Find_NodeElement(this,pID_B,ENET_Texture,(CAMFImporter_NodeElement **)&CopyTextureData);
    if (!bVar4) {
      Throw_ID_NotFound(this,pID_B);
    }
    psVar8 = CopyTextureData.tex_size;
    src_texture[2] = (CAMFImporter_NodeElement_Texture *)CopyTextureData.tex_size;
    tex_size = (size_t)CopyTextureData.tex_size;
    std::vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
    ::emplace_back<CAMFImporter_NodeElement_Texture*>
              ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                *)&src_texture_4check,(CAMFImporter_NodeElement_Texture **)&tex_size);
  }
  if (pID_A->_M_string_length == 0) {
    src_texture[3] = (CAMFImporter_NodeElement_Texture *)0x0;
    CopyTextureData.tex_size = (size_t *)0x0;
  }
  else {
    bVar4 = Find_NodeElement(this,pID_A,ENET_Texture,(CAMFImporter_NodeElement **)&CopyTextureData);
    if (!bVar4) {
      Throw_ID_NotFound(this,pID_A);
    }
    src_texture[3] = (CAMFImporter_NodeElement_Texture *)CopyTextureData.tex_size;
    tex_size = (size_t)CopyTextureData.tex_size;
    std::vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
    ::emplace_back<CAMFImporter_NodeElement_Texture*>
              ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                *)&src_texture_4check,(CAMFImporter_NodeElement_Texture **)&tex_size);
  }
  uVar6 = (long)src_texture_4check.
                super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)src_texture_4check.
                super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (1 < uVar6) {
    uVar7 = 1;
    while (uVar6 != uVar7) {
      pCVar1 = src_texture_4check.
               super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7 - 1];
      pCVar2 = src_texture_4check.
               super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7];
      if (((pCVar1->Width != pCVar2->Width) || (pCVar1->Height != pCVar2->Height)) ||
         (uVar7 = uVar7 + 1, pCVar1->Depth != pCVar2->Depth)) {
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&CopyTextureData,
                   "PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size."
                   ,(allocator<char> *)&tex_size);
        DeadlyImportError::DeadlyImportError(pDVar5,(string *)&CopyTextureData);
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  converted_texture.Width =
       (*src_texture_4check.
         super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
         ._M_impl.super__Vector_impl_data._M_start)->Width;
  converted_texture.Height =
       (*src_texture_4check.
         super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
         ._M_impl.super__Vector_impl_data._M_start)->Height;
  converted_texture.Depth =
       (*src_texture_4check.
         super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
         ._M_impl.super__Vector_impl_data._M_start)->Depth;
  converted_texture.Tiled = false;
  for (uVar7 = 0; uVar7 = uVar7 & 0xff, uVar7 < uVar6; uVar7 = (ulong)((int)uVar7 + 1)) {
    converted_texture.Tiled =
         (bool)(converted_texture.Tiled |
               src_texture_4check.
               super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7]->Tiled);
  }
  builtin_strncpy(converted_texture.FormatHint,"rgba0000",9);
  if (pID_R->_M_string_length != 0) {
    builtin_strncpy(converted_texture.FormatHint,"rgba8000",8);
  }
  if (pID_G->_M_string_length != 0) {
    converted_texture.FormatHint[5] = '8';
  }
  if (pID_B->_M_string_length != 0) {
    converted_texture.FormatHint[6] = '8';
  }
  if (pID_A->_M_string_length != 0) {
    converted_texture.FormatHint[7] = '8';
  }
  tex_size = 0;
  bVar4 = local_c8 != (size_t *)0x0 && pID_R->_M_string_length != 0;
  if (bVar4) {
    tex_size = local_c8[0xe] - local_c8[0xd];
  }
  uVar6 = (ulong)bVar4;
  pOffset = uVar6;
  if (psVar10 != (size_t *)0x0 && pID_G->_M_string_length != 0) {
    tex_size = tex_size + (psVar10[0xe] - psVar10[0xd]);
    pOffset = uVar6 + 1;
  }
  pStep = pOffset;
  if (psVar8 != (size_t *)0x0 && pID_B->_M_string_length != 0) {
    tex_size = tex_size + (psVar8[0xe] - psVar8[0xd]);
    pStep = pOffset + 1;
  }
  if (CopyTextureData.tex_size != (size_t *)0x0 && pID_A->_M_string_length != 0) {
    tex_size = tex_size + (CopyTextureData.tex_size[0xe] - CopyTextureData.tex_size[0xd]);
    pStep = pStep + 1;
  }
  converted_texture.Data = (uint8_t *)operator_new__(tex_size);
  CopyTextureData.tex_size = &tex_size;
  CopyTextureData.src_texture = &src_texture;
  CopyTextureData.converted_texture = &converted_texture;
  PostprocessHelper_GetTextureID_Or_Create::anon_class_24_3_c796a13c::operator()
            (&CopyTextureData,pID_R,0,pStep,'\0');
  PostprocessHelper_GetTextureID_Or_Create::anon_class_24_3_c796a13c::operator()
            (&CopyTextureData,pID_G,uVar6,pStep,'\x01');
  PostprocessHelper_GetTextureID_Or_Create::anon_class_24_3_c796a13c::operator()
            (&CopyTextureData,pID_B,pOffset,pStep,'\x02');
  PostprocessHelper_GetTextureID_Or_Create::anon_class_24_3_c796a13c::operator()
            (&CopyTextureData,pID_A,pStep - 1,pStep,'\x03');
  std::__cxx11::string::_M_assign((string *)&converted_texture);
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::
  push_back(this_00,&converted_texture);
  std::__cxx11::string::~string((string *)&converted_texture);
  std::
  _Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  ::~_Vector_base(&src_texture_4check.
                   super__Vector_base<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
                 );
LAB_003c1df1:
  std::__cxx11::string::~string((string *)&TextureConverted_ID);
  return sVar9;
}

Assistant:

size_t AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string& pID_R, const std::string& pID_G, const std::string& pID_B,
																const std::string& pID_A)
{
    size_t TextureConverted_Index;
    std::string TextureConverted_ID;

	// check input data
	if(pID_R.empty() && pID_G.empty() && pID_B.empty() && pID_A.empty())
		throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.");

	// Create ID
	TextureConverted_ID = pID_R + "_" + pID_G + "_" + pID_B + "_" + pID_A;
	// Check if texture specified by set of IDs is converted already.
	TextureConverted_Index = 0;
	for(const SPP_Texture& tex_convd: mTexture_Converted)
	{
        if ( tex_convd.ID == TextureConverted_ID ) {
            return TextureConverted_Index;
        } else {
            ++TextureConverted_Index;
        }
	}

	//
	// Converted texture not found, create it.
	//
	CAMFImporter_NodeElement_Texture* src_texture[4]{nullptr};
	std::vector<CAMFImporter_NodeElement_Texture*> src_texture_4check;
	SPP_Texture converted_texture;

	{// find all specified source textures
		CAMFImporter_NodeElement* t_tex;

		// R
		if(!pID_R.empty())
		{
			if(!Find_NodeElement(pID_R, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_R);

			src_texture[0] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[0] = nullptr;
		}

		// G
		if(!pID_G.empty())
		{
			if(!Find_NodeElement(pID_G, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_G);

			src_texture[1] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[1] = nullptr;
		}

		// B
		if(!pID_B.empty())
		{
			if(!Find_NodeElement(pID_B, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_B);

			src_texture[2] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[2] = nullptr;
		}

		// A
		if(!pID_A.empty())
		{
			if(!Find_NodeElement(pID_A, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_A);

			src_texture[3] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[3] = nullptr;
		}
	}// END: find all specified source textures

	// check that all textures has same size
	if(src_texture_4check.size() > 1)
	{
		for (size_t i = 0, i_e = (src_texture_4check.size() - 1); i < i_e; i++)
		{
			if((src_texture_4check[i]->Width != src_texture_4check[i + 1]->Width) || (src_texture_4check[i]->Height != src_texture_4check[i + 1]->Height) ||
				(src_texture_4check[i]->Depth != src_texture_4check[i + 1]->Depth))
			{
				throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size.");
			}
		}
	}// if(src_texture_4check.size() > 1)

	// set texture attributes
	converted_texture.Width = src_texture_4check[0]->Width;
	converted_texture.Height = src_texture_4check[0]->Height;
	converted_texture.Depth = src_texture_4check[0]->Depth;
	// if one of source texture is tiled then converted texture is tiled too.
	converted_texture.Tiled = false;
	for(uint8_t i = 0; i < src_texture_4check.size(); i++) converted_texture.Tiled |= src_texture_4check[i]->Tiled;

	// Create format hint.
	strcpy(converted_texture.FormatHint, "rgba0000");// copy initial string.
	if(!pID_R.empty()) converted_texture.FormatHint[4] = '8';
	if(!pID_G.empty()) converted_texture.FormatHint[5] = '8';
	if(!pID_B.empty()) converted_texture.FormatHint[6] = '8';
	if(!pID_A.empty()) converted_texture.FormatHint[7] = '8';

	//
	// Сopy data of textures.
	//
	size_t tex_size = 0;
	size_t step = 0;
	size_t off_g = 0;
	size_t off_b = 0;

	// Calculate size of the target array and rule how data will be copied.
    if(!pID_R.empty() && nullptr != src_texture[ 0 ] ) {
        tex_size += src_texture[0]->Data.size(); step++, off_g++, off_b++;
    }
    if(!pID_G.empty() && nullptr != src_texture[ 1 ] ) {
        tex_size += src_texture[1]->Data.size(); step++, off_b++;
    }
    if(!pID_B.empty() && nullptr != src_texture[ 2 ] ) {
        tex_size += src_texture[2]->Data.size(); step++;
    }
    if(!pID_A.empty() && nullptr != src_texture[ 3 ] ) {
        tex_size += src_texture[3]->Data.size(); step++;
    }

    // Create target array.
	converted_texture.Data = new uint8_t[tex_size];
	// And copy data
	auto CopyTextureData = [&](const std::string& pID, const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void
	{
		if(!pID.empty())
		{
			for(size_t idx_target = pOffset, idx_src = 0; idx_target < tex_size; idx_target += pStep, idx_src++) {
				CAMFImporter_NodeElement_Texture* tex = src_texture[pSrcTexNum];
				ai_assert(tex);
				converted_texture.Data[idx_target] = tex->Data.at(idx_src);
			}
		}
	};// auto CopyTextureData = [&](const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void

	CopyTextureData(pID_R, 0, step, 0);
	CopyTextureData(pID_G, off_g, step, 1);
	CopyTextureData(pID_B, off_b, step, 2);
	CopyTextureData(pID_A, step - 1, step, 3);

	// Store new converted texture ID
	converted_texture.ID = TextureConverted_ID;
	// Store new converted texture
	mTexture_Converted.push_back(converted_texture);

	return TextureConverted_Index;
}